

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.hpp
# Opt level: O0

void de::cmdline::detail::Parser::dispatchParse<tcu::opt::Visibility>
               (OptInfo *info,char *src,TypedFieldMap *dst)

{
  ValueType *value_00;
  void *pvVar1;
  void *match;
  ValueType *value;
  TypedFieldMap *dst_local;
  char *src_local;
  OptInfo *info_local;
  
  value_00 = (ValueType *)operator_new(4);
  *value_00 = WINDOWVISIBILITY_WINDOWED;
  if (info->parse == (GenericParseFunc)0x0) {
    pvVar1 = findNamedValueMatch(src,info->namedValues,info->namedValuesEnd,info->namedValueStride);
    *value_00 = *(ValueType *)((long)pvVar1 + 8);
  }
  else {
    (*info->parse)(src,value_00);
  }
  TypedFieldMap::set<tcu::opt::Visibility>(dst,value_00);
  return;
}

Assistant:

void Parser::dispatchParse (const OptInfo* info, const char* src, TypedFieldMap* dst)
{
	typename OptTraits<OptType>::ValueType* value = new typename OptTraits<OptType>::ValueType();
	try
	{
		DE_ASSERT((!!info->parse) != (!!info->namedValues));
		if (info->parse)
		{
			((typename Option<OptType>::ParseFunc)(info->parse))(src, value);
		}
		else
		{
			const void* match = findNamedValueMatch(src, info->namedValues, info->namedValuesEnd, info->namedValueStride);
			*value = static_cast<const NamedValue<typename OptTraits<OptType>::ValueType>*>(match)->value;
		}
		dst->set<OptType>(value);
	}
	catch (...)
	{
		delete value;
		throw;
	}
}